

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_vendorio.cpp
# Opt level: O1

void __thiscall StreamVendorIo::PrintMoreCoinsNeeded(StreamVendorIo *this,int amount)

{
  ostream *poVar1;
  
  poVar1 = this->os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Please insert ",0xe);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,amount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," more cents.",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void StreamVendorIo::PrintMoreCoinsNeeded(int amount) {
    os << "Please insert " << amount << " more cents." << endl;
}